

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fighter.cpp
# Opt level: O0

bool __thiscall Fighter::critical(Fighter *this)

{
  long lVar1;
  double dVar2;
  double rand_int;
  Fighter *this_local;
  
  lVar1 = random();
  dVar2 = pow(this->_critical_points / 4.0,4.0);
  return 1.0 / (dVar2 + 1.0) < (double)(lVar1 % 0x7fffffff) / 2147483647.0;
}

Assistant:

bool Fighter::critical() {
    double rand_int = (random() % RAND_MAX) / (double)RAND_MAX;
    return rand_int >
                            1
        / //---------------------------------------
           (1 + pow(_critical_points/4.0, 4));
}